

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

void __thiscall QToolBarLayout::setGeometry(QToolBarLayout *this,QRect *rect)

{
  undefined4 uVar1;
  Representation RVar2;
  long lVar3;
  int iVar5;
  ulong uVar4;
  ulong uVar6;
  Representation RVar7;
  Representation RVar8;
  bool bVar9;
  int iVar10;
  Orientation OVar11;
  ToolBarArea TVar12;
  LayoutDirection direction;
  QWidget *pQVar13;
  QStyle *pQVar14;
  QSize QVar15;
  QMainWindow *this_00;
  undefined8 uVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  Representation RVar22;
  Representation RVar23;
  Representation RVar24;
  long in_FS_OFFSET;
  QMargins QVar25;
  Representation local_c8;
  int local_b8;
  QRect local_a8;
  QStyleOptionToolBar opt;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = QLayout::parentWidget(&this->super_QLayout);
  pQVar13 = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&pQVar13->super_QObject)->
             super_QWidget;
  if (pQVar13 != (QWidget *)0x0) {
    pQVar14 = QWidget::style(pQVar13);
    opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionToolBar::QStyleOptionToolBar(&opt);
    (**(code **)(*(long *)pQVar13 + 0x1a0))(pQVar13,&opt);
    QVar25 = QLayout::contentsMargins(&this->super_QLayout);
    iVar10 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x39,&opt,pQVar13);
    OVar11 = QToolBar::orientation((QToolBar *)pQVar13);
    QLayout::setGeometry(&this->super_QLayout,rect);
    bVar17 = (this->super_QLayout).super_QLayoutItem.field_0xd;
    if (bVar17 == 0) {
      QVar15 = QRect::size(rect);
      local_a8.x1.m_i = QVar15.wd.m_i;
      local_a8.y1.m_i = QVar15.ht.m_i;
      bVar9 = layoutActions(this,(QSize *)&local_a8);
      bVar17 = (this->super_QLayout).super_QLayoutItem.field_0xd;
    }
    else {
      bVar9 = false;
    }
    if ((((this->super_QLayout).super_QLayoutItem.field_0xc == '\0') && (bVar9 == false)) &&
       ((bVar17 & 1) == 0)) {
      if ((((this->extension->super_QToolButton).super_QAbstractButton.super_QWidget.data)->
           widget_attributes & 0x10000) == 0) {
        QWidget::hide((QWidget *)this->extension);
      }
    }
    else {
      RVar23 = QVar25.m_bottom.m_i;
      this_00 = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                          (*(QObject **)(*(long *)&pQVar13->field_0x8 + 0x10));
      if (this_00 == (QMainWindow *)0x0) {
        TVar12 = TopToolBarArea;
      }
      else {
        TVar12 = QMainWindow::toolBarArea(this_00,(QToolBar *)pQVar13);
      }
      uVar16 = (**(code **)(*(long *)&this->super_QLayout + 0xf0))(this);
      uVar1 = rect->x2;
      iVar5 = (rect->y2).m_i;
      iVar19 = iVar5;
      if (OVar11 == Horizontal) {
        iVar19 = uVar1;
      }
      RVar2 = QVar25.m_right.m_i;
      RVar22.m_i = RVar2.m_i;
      if (OVar11 == Horizontal) {
        RVar22.m_i = RVar23.m_i;
      }
      iVar20 = (iVar19 - (RVar22.m_i + iVar10)) + 2;
      local_a8.y1.m_i = 0;
      iVar19 = iVar20;
      if (OVar11 != Horizontal) {
        iVar19 = local_a8.y1.m_i;
        local_a8.y1.m_i = iVar20;
      }
      iVar20 = (int)((ulong)uVar16 >> 0x20);
      RVar22 = QVar25.m_top.m_i;
      local_c8 = QVar25.m_left.m_i;
      local_b8 = (int)uVar16;
      if ((TVar12 == TopToolBarArea) || (TVar12 == LeftToolBarArea)) {
        uVar4._0_4_ = rect->x1;
        uVar4._4_4_ = rect->y1;
        uVar6 = uVar4 >> 0x20;
        if (OVar11 == Vertical) {
          uVar6 = uVar4;
        }
        RVar7.m_i = local_c8.m_i;
        if (OVar11 == Vertical) {
          RVar7.m_i = RVar22.m_i;
        }
        iVar5 = RVar7.m_i + (int)uVar6;
      }
      else {
        RVar24.m_i = RVar23.m_i;
        iVar18 = iVar20;
        RVar7.m_i = RVar2.m_i;
        RVar8.m_i = RVar22.m_i;
        if (OVar11 == Vertical) {
          RVar24.m_i = RVar2.m_i;
          iVar18 = local_b8;
          RVar7.m_i = RVar23.m_i;
          RVar8.m_i = local_c8.m_i;
        }
        if (OVar11 == Vertical) {
          iVar5 = uVar1;
        }
        iVar5 = ((RVar24.m_i + RVar8.m_i) - (iVar18 + RVar7.m_i)) + 1 + iVar5;
      }
      iVar21 = iVar10;
      local_a8.x1.m_i = iVar5;
      iVar18 = -1;
      if ((OVar11 != Vertical) &&
         (local_a8.x1.m_i = iVar19, local_a8.y1.m_i = iVar5, iVar18 = -1, OVar11 == Horizontal)) {
        iVar21 = -1;
        iVar18 = iVar10;
      }
      if (OVar11 == Vertical) {
        RVar23.m_i = RVar2.m_i;
        iVar20 = local_b8;
        RVar22.m_i = local_c8.m_i;
      }
      iVar20 = iVar20 - (RVar23.m_i + RVar22.m_i);
      iVar10 = iVar20;
      if (OVar11 == Vertical) {
        iVar10 = iVar21;
        iVar18 = iVar20;
      }
      local_a8.x2.m_i = local_a8.x1.m_i + -1 + iVar18;
      local_a8.y2.m_i = local_a8.y1.m_i + iVar10 + -1;
      if (OVar11 == Horizontal) {
        pQVar13 = QLayout::parentWidget(&this->super_QLayout);
        direction = QWidget::layoutDirection(pQVar13);
        local_a8 = QStyle::visualRect(direction,rect,&local_a8);
      }
      QWidget::setGeometry((QWidget *)this->extension,&local_a8);
      if ((((this->extension->super_QToolButton).super_QAbstractButton.super_QWidget.data)->
           widget_attributes & 0x10000) != 0) {
        QWidget::show((QWidget *)this->extension);
      }
    }
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::setGeometry(const QRect &rect)
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const QMargins margins = contentsMargins();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();

    QLayout::setGeometry(rect);

    updateMacBorderMetrics();

    bool ranOutOfSpace = false;
    if (!animating)
        ranOutOfSpace = layoutActions(rect.size());

    if (expanded || animating || ranOutOfSpace) {
        Qt::ToolBarArea area = Qt::TopToolBarArea;
        if (QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget()))
            area = win->toolBarArea(tb);
        QSize hint = sizeHint();

        QPoint pos;
        rpick(o, pos) = pick(o, rect.bottomRight()) -
                pick(o, QSize(margins.bottom(), margins.right())) - extensionExtent + 2;
        if (area == Qt::LeftToolBarArea || area == Qt::TopToolBarArea)
            rperp(o, pos) = perp(o, rect.topLeft()) +
                    perp(o, QSize(margins.top(), margins.left()));
        else
            rperp(o, pos) = perp(o, rect.bottomRight()) -
                    perp(o, QSize(margins.bottom(), margins.right())) -
                    (perp(o, hint) - perp(o, margins)) + 1;
        QSize size;
        rpick(o, size) = extensionExtent;
        rperp(o, size) = perp(o, hint) - perp(o, margins);
        QRect r(pos, size);

        if (o == Qt::Horizontal)
            r = QStyle::visualRect(parentWidget()->layoutDirection(), rect, r);

        extension->setGeometry(r);

        if (extension->isHidden())
            extension->show();
    } else {
        if (!extension->isHidden())
            extension->hide();
    }
}